

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  char cVar6;
  CURLUcode CVar7;
  int iVar8;
  CURLcode CVar9;
  CURLUcode CVar10;
  size_t sVar11;
  long lVar12;
  char *pcVar13;
  size_t sVar14;
  Curl_handler *pCVar15;
  char *pcVar16;
  uint uVar17;
  uint uVar18;
  size_t buflen;
  byte *mem;
  byte bVar19;
  uint uVar20;
  CURLU *pCVar21;
  bool bVar22;
  char *oldurl;
  char *decoded;
  uchar out [3];
  CURLU *local_a0;
  byte *local_88;
  dynbuf local_80;
  uint local_5c;
  char *local_58;
  dynbuf local_50;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  local_88 = (byte *)part;
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      pCVar21 = (CURLU *)0x0;
      break;
    case CURLUPART_SCHEME:
      u->field_0x52 = u->field_0x52 & 0xfb;
      pCVar21 = u;
      break;
    case CURLUPART_USER:
      pCVar21 = (CURLU *)&u->user;
      break;
    case CURLUPART_PASSWORD:
      pCVar21 = (CURLU *)&u->password;
      break;
    case CURLUPART_OPTIONS:
      pCVar21 = (CURLU *)&u->options;
      break;
    case CURLUPART_HOST:
      pCVar21 = (CURLU *)&u->host;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      pCVar21 = (CURLU *)&u->port;
      break;
    case CURLUPART_PATH:
      pCVar21 = (CURLU *)&u->path;
      break;
    case CURLUPART_QUERY:
      u->field_0x52 = u->field_0x52 & 0xfe;
      pCVar21 = (CURLU *)&u->query;
      break;
    case CURLUPART_FRAGMENT:
      u->field_0x52 = u->field_0x52 & 0xfd;
      pCVar21 = (CURLU *)&u->fragment;
      break;
    case CURLUPART_ZONEID:
      pCVar21 = (CURLU *)&u->zoneid;
      break;
    default:
      goto switchD_001671ce_default;
    }
    if (pCVar21 == (CURLU *)0x0) {
      free_urlhandle(u);
      u->query = (char *)0x0;
      u->fragment = (char *)0x0;
      u->port = (char *)0x0;
      u->path = (char *)0x0;
      u->host = (char *)0x0;
      u->zoneid = (char *)0x0;
      u->password = (char *)0x0;
      u->options = (char *)0x0;
      u->scheme = (char *)0x0;
      u->user = (char *)0x0;
      *(undefined8 *)&u->portnum = 0;
      return CURLUE_OK;
    }
    if (pCVar21->scheme != (char *)0x0) {
      (*Curl_cfree)(pCVar21->scheme);
      pCVar21->scheme = (char *)0x0;
      return CURLUE_OK;
    }
    return CURLUE_OK;
  }
  sVar11 = strlen(part);
  CVar7 = CURLUE_MALFORMED_INPUT;
  if (8000000 < sVar11) {
    return CURLUE_MALFORMED_INPUT;
  }
  if (CURLUPART_ZONEID < what) {
switchD_001671ce_default:
    return CURLUE_UNKNOWN_PART;
  }
  bVar5 = (byte)flags >> 7;
  switch(what) {
  case CURLUPART_URL:
    if (sVar11 == 0) {
      return CURLUE_MALFORMED_INPUT;
    }
    sVar14 = Curl_is_absolute_url(part,(char *)0x0,buflen,(flags & 0x204) != 0);
    if ((sVar14 == 0) &&
       (CVar7 = curl_url_get(u,CURLUPART_URL,&local_80.bufr,flags), CVar7 == CURLUE_OK)) {
      CVar7 = redirect_url((char *)CONCAT62(local_80.bufr._2_6_,(unsigned_short)local_80.bufr),
                           (char *)local_88,u,flags);
      (*Curl_cfree)((void *)CONCAT62(local_80.bufr._2_6_,(unsigned_short)local_80.bufr));
      return CVar7;
    }
    CVar7 = parseurl_and_replace((char *)local_88,u,flags);
    return CVar7;
  case CURLUPART_SCHEME:
    CVar7 = CURLUE_BAD_SCHEME;
    if (sVar11 - 0x29 < 0xffffffffffffffd8) {
LAB_001672d1:
      bVar22 = false;
      local_a0 = (CURLU *)0x0;
    }
    else {
      if (((flags & 8) == 0) &&
         (pCVar15 = Curl_get_scheme_handler(part), pCVar15 == (Curl_handler *)0x0)) {
        CVar7 = CURLUE_UNSUPPORTED_SCHEME;
        goto LAB_001672d1;
      }
      local_a0 = u;
      if ((byte)((*part & 0xdfU) + 0xbf) < 0x1a) {
        if (sVar11 != 1) {
          lVar12 = 0;
          do {
            bVar5 = part[lVar12];
            if (((9 < (byte)(bVar5 - 0x30)) && (0x19 < (byte)((bVar5 & 0xdf) + 0xbf))) &&
               ((0x2e < bVar5 || ((0x680000000000U >> ((ulong)bVar5 & 0x3f) & 1) == 0))))
            goto LAB_00167813;
            lVar12 = lVar12 + 1;
          } while (sVar11 - 1 != lVar12);
        }
        u->field_0x52 = u->field_0x52 & 0xfb;
        bVar22 = true;
        bVar5 = 0;
      }
      else {
LAB_00167813:
        bVar22 = false;
        bVar5 = 0;
      }
    }
    if (!bVar22) {
      return CVar7;
    }
    bVar22 = true;
    uVar20 = 0;
    uVar17 = 0;
    goto LAB_00167399;
  case CURLUPART_USER:
    local_a0 = (CURLU *)&u->user;
    break;
  case CURLUPART_PASSWORD:
    local_a0 = (CURLU *)&u->password;
    break;
  case CURLUPART_OPTIONS:
    local_a0 = (CURLU *)&u->options;
    break;
  case CURLUPART_HOST:
    local_a0 = (CURLU *)&u->host;
    (*Curl_cfree)(u->zoneid);
    u->zoneid = (char *)0x0;
    break;
  case CURLUPART_PORT:
    if (9 < (byte)(*part - 0x30U)) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    iVar8 = Curl_str_number((char **)&local_88,(curl_off_t *)&local_80,0xffff);
    if (iVar8 != 0) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    if (*local_88 != 0) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    pcVar13 = curl_maprintf("%ld",CONCAT62(local_80.bufr._2_6_,(unsigned_short)local_80.bufr));
    if (pcVar13 == (char *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    (*Curl_cfree)(u->port);
    u->port = pcVar13;
    u->portnum = (unsigned_short)local_80.bufr;
    return CURLUE_OK;
  case CURLUPART_PATH:
    local_a0 = (CURLU *)&u->path;
    uVar17 = 0x184901;
    uVar20 = 0;
    bVar22 = true;
    goto LAB_00167399;
  case CURLUPART_QUERY:
    bVar22 = -1 < (char)(byte)flags;
    uVar20 = flags >> 8;
    local_a0 = (CURLU *)&u->query;
    u->field_0x52 = u->field_0x52 | 1;
    goto LAB_00167397;
  case CURLUPART_FRAGMENT:
    u->field_0x52 = u->field_0x52 | 2;
    local_a0 = (CURLU *)&u->fragment;
    break;
  case CURLUPART_ZONEID:
    local_a0 = (CURLU *)&u->zoneid;
  }
  bVar22 = true;
  uVar20 = 0;
LAB_00167397:
  uVar17 = 0;
LAB_00167399:
  local_5c = uVar17;
  Curl_dyn_init(&local_80,(ulong)(uVar17 & 0xff) + sVar11 * 3 + 1);
  if (((char)uVar17 != '\0') && (*local_88 != 0x2f)) {
    CVar9 = Curl_dyn_addn(&local_80,"/",1);
    CVar10 = CURLUE_OUT_OF_MEMORY;
    if (CVar9 == CURLE_TOO_LARGE) {
      CVar10 = CURLUE_TOO_LARGE;
    }
    if (CVar9 != CURLE_OK) {
      return CVar10;
    }
  }
  bVar19 = (byte)uVar20;
  if (bVar5 == 0) {
    CVar9 = Curl_dyn_add(&local_80,(char *)local_88);
    if (CVar9 == CURLE_OK) {
      pcVar13 = Curl_dyn_ptr(&local_80);
      do {
        lVar12 = 1;
        if (*pcVar13 == '%') {
          bVar2 = pcVar13[1];
          if (((((byte)(bVar2 - 0x30) < 10) ||
               ((bVar2 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) != 0)
                ))) && ((bVar3 = pcVar13[2], (byte)(bVar3 - 0x30) < 10 ||
                        ((bVar3 - 0x41 < 0x26 &&
                         ((0x3f0000003fU >> ((ulong)(bVar3 - 0x41) & 0x3f) & 1) != 0)))))) &&
             ((byte)(bVar2 + 0xbf) < 0x1a || (byte)(bVar3 + 0xbf) < 0x1a)) {
            cVar6 = Curl_raw_tolower(bVar2);
            pcVar13[1] = cVar6;
            cVar6 = Curl_raw_tolower(pcVar13[2]);
            pcVar13[2] = cVar6;
            lVar12 = 3;
          }
        }
        else if (*pcVar13 == '\0') goto LAB_00167648;
        pcVar13 = pcVar13 + lVar12;
      } while( true );
    }
    CVar7 = CURLUE_OUT_OF_MEMORY;
    if (CVar9 == CURLE_TOO_LARGE) {
      CVar7 = CURLUE_TOO_LARGE;
    }
LAB_00167648:
    if (CVar9 != CURLE_OK) {
      return CVar7;
    }
  }
  else {
    bVar2 = *local_88;
    mem = local_88;
    while (bVar2 != 0) {
      if (bVar2 == 0x20 && !bVar22) {
        CVar9 = Curl_dyn_addn(&local_80,"+",1);
        if (CVar9 != CURLE_OK) {
LAB_001674a1:
          CVar10 = CURLUE_OUT_OF_MEMORY;
          goto LAB_001674a6;
        }
LAB_001674fa:
        bVar4 = true;
      }
      else {
        if (((byte)(bVar2 - 0x30) < 10) || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) {
LAB_00167467:
          uVar18 = uVar20 & 0xff;
          uVar17 = uVar18;
          if ((uVar20 & 1) != 0) {
            uVar17 = 0;
          }
          uVar20 = uVar17;
          if (bVar2 != 0x3d) {
            uVar20 = uVar18;
          }
          CVar9 = Curl_dyn_addn(&local_80,mem,1);
          if (CVar9 == CURLE_OK) goto LAB_001674fa;
          CVar10 = CURLUE_TOO_LARGE;
          if (CVar9 != CURLE_TOO_LARGE) goto LAB_001674a1;
        }
        else {
          if (bVar2 < 0x3d) {
            if ((1 < bVar2 - 0x2d) && ((bVar2 != 0x2f || ((char)local_5c == '\0'))))
            goto LAB_001674b0;
            goto LAB_00167467;
          }
          if (bVar2 == 0x3d) {
            if ((uVar20 & 1) != 0) goto LAB_00167467;
          }
          else if ((bVar2 == 0x5f) || (bVar2 == 0x7e)) goto LAB_00167467;
LAB_001674b0:
          local_50.bufr._2_1_ = 0;
          local_50.bufr._0_2_ = 0x25;
          Curl_hexbyte((uchar *)((long)&local_50.bufr + 1),*mem,true);
          CVar9 = Curl_dyn_addn(&local_80,&local_50,3);
          CVar10 = CURLUE_TOO_LARGE;
          if (CVar9 != CURLE_TOO_LARGE) {
            CVar10 = CURLUE_OUT_OF_MEMORY;
          }
          if (CVar9 == CURLE_OK) goto LAB_001674fa;
        }
LAB_001674a6:
        CVar7 = CVar10;
        bVar4 = false;
      }
      if (!bVar4) break;
      pbVar1 = mem + 1;
      mem = mem + 1;
      bVar2 = *pbVar1;
    }
    if (bVar2 != 0) {
      return CVar7;
    }
  }
  pcVar13 = Curl_dyn_ptr(&local_80);
  if ((bVar19 & pcVar13 != (char *)0x0) == 1) {
    pcVar16 = u->query;
    if (pcVar16 == (char *)0x0) {
      sVar11 = 0;
    }
    else {
      sVar11 = strlen(pcVar16);
    }
    if (sVar11 != 0) {
      cVar6 = pcVar16[sVar11 - 1];
      Curl_dyn_init(&local_50,8000000);
      CVar9 = Curl_dyn_addn(&local_50,u->query,sVar11);
      if ((CVar9 == CURLE_OK) &&
         (((cVar6 == '&' || (CVar9 = Curl_dyn_addn(&local_50,"&",1), CVar9 == CURLE_OK)) &&
          (CVar9 = Curl_dyn_add(&local_50,pcVar13), CVar9 == CURLE_OK)))) {
        Curl_dyn_free(&local_80);
        (*Curl_cfree)(local_a0->scheme);
        pcVar16 = Curl_dyn_ptr(&local_50);
        local_a0->scheme = pcVar16;
        CVar7 = CURLUE_OK;
      }
      else {
        Curl_dyn_free(&local_80);
        CVar7 = CURLUE_OUT_OF_MEMORY;
      }
    }
    if (sVar11 != 0) {
      return CVar7;
    }
  }
  else if (what == CURLUPART_HOST) {
    sVar14 = Curl_dyn_len(&local_80);
    bVar22 = true;
    if (((byte)(flags >> 10) & sVar14 == 0) == 0) {
      if (sVar14 == 0) {
        bVar22 = true;
      }
      else if (bVar5 == 0) {
        local_58 = (char *)0x0;
        CVar9 = Curl_urldecode(pcVar13,sVar14,&local_58,(size_t *)&local_50,REJECT_CTRL);
        if ((CVar9 == CURLE_OK) &&
           (CVar10 = hostname_check(u,local_58,
                                    CONCAT53(local_50.bufr._3_5_,
                                             CONCAT12(local_50.bufr._2_1_,local_50.bufr._0_2_))),
           CVar10 == CURLUE_OK)) {
          bVar22 = false;
        }
        else {
          bVar22 = true;
        }
        (*Curl_cfree)(local_58);
      }
      else {
        CVar10 = hostname_check(u,pcVar13,sVar14);
        bVar22 = CVar10 != CURLUE_OK;
      }
      if (bVar22) {
        Curl_dyn_free(&local_80);
        CVar7 = CURLUE_BAD_HOSTNAME;
      }
      bVar22 = (bool)(bVar22 ^ 1);
    }
    if (!bVar22) {
      return CVar7;
    }
  }
  (*Curl_cfree)(local_a0->scheme);
  local_a0->scheme = pcVar13;
  return CURLUE_OK;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  bool urlencode = (flags & CURLU_URLENCODE) ? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool leadingslash = FALSE;
  bool appendquery = FALSE;
  bool equalsencode = FALSE;
  size_t nalloc;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      u->guessed_scheme = FALSE;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_ZONEID:
      storep = &u->zoneid;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      u->query_present = FALSE;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      u->fragment_present = FALSE;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      Curl_safefree(*storep);
    }
    else if(!storep) {
      free_urlhandle(u);
      memset(u, 0, sizeof(struct Curl_URL));
    }
    return CURLUE_OK;
  }

  nalloc = strlen(part);
  if(nalloc > CURL_MAX_INPUT_LENGTH)
    /* excessive input length */
    return CURLUE_MALFORMED_INPUT;

  switch(what) {
  case CURLUPART_SCHEME: {
    size_t plen = strlen(part);
    const char *s = part;
    if((plen > MAX_SCHEME_LEN) || (plen < 1))
      /* too long or too short */
      return CURLUE_BAD_SCHEME;
   /* verify that it is a fine scheme */
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) && !Curl_get_scheme_handler(part))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    if(ISALPHA(*s)) {
      /* ALPHA *( ALPHA / DIGIT / "+" / "-" / "." ) */
      while(--plen) {
        if(ISALNUM(*s) || (*s == '+') || (*s == '-') || (*s == '.'))
          s++; /* fine */
        else
          return CURLUE_BAD_SCHEME;
      }
    }
    else
      return CURLUE_BAD_SCHEME;
    u->guessed_scheme = FALSE;
    break;
  }
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST:
    storep = &u->host;
    Curl_safefree(u->zoneid);
    break;
  case CURLUPART_ZONEID:
    storep = &u->zoneid;
    break;
  case CURLUPART_PORT:
    if(!ISDIGIT(part[0]))
      /* not a number */
      return CURLUE_BAD_PORT_NUMBER;
    else {
      char *tmp;
      curl_off_t port;
      if(Curl_str_number(&part, &port, 0xffff) || *part)
        /* weirdly provided number, not good! */
        return CURLUE_BAD_PORT_NUMBER;
      tmp = aprintf("%" CURL_FORMAT_CURL_OFF_T, port);
      if(!tmp)
        return CURLUE_OUT_OF_MEMORY;
      free(u->port);
      u->port = tmp;
      u->portnum = (unsigned short)port;
      return CURLUE_OK;
    }
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    leadingslash = TRUE; /* enforce */
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY) ? 1 : 0;
    equalsencode = appendquery;
    storep = &u->query;
    u->query_present = TRUE;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    u->fragment_present = TRUE;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLUcode uc;
    char *oldurl;

    if(!nalloc)
      /* a blank URL is not a valid URL */
      return CURLUE_MALFORMED_INPUT;

    /* if the new thing is absolute or the old one is not (we could not get an
     * absolute URL in 'oldurl'), then replace the existing with the new. */
    if(Curl_is_absolute_url(part, NULL, 0,
                            flags & (CURLU_GUESS_SCHEME|CURLU_DEFAULT_SCHEME))
       || curl_url_get(u, CURLUPART_URL, &oldurl, flags)) {
      return parseurl_and_replace(part, u, flags);
    }
    DEBUGASSERT(oldurl); /* it is set here */
    /* apply the relative part to create a new URL */
    uc = redirect_url(oldurl, part, u, flags);
    free(oldurl);
    return uc;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  DEBUGASSERT(storep);
  {
    const char *newp;
    struct dynbuf enc;
    Curl_dyn_init(&enc, nalloc * 3 + 1 + leadingslash);

    if(leadingslash && (part[0] != '/')) {
      CURLcode result = Curl_dyn_addn(&enc, "/", 1);
      if(result)
        return cc2cu(result);
    }
    if(urlencode) {
      const unsigned char *i;

      for(i = (const unsigned char *)part; *i; i++) {
        CURLcode result;
        if((*i == ' ') && plusencode) {
          result = Curl_dyn_addn(&enc, "+", 1);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
        else if(ISUNRESERVED(*i) ||
                ((*i == '/') && urlskipslash) ||
                ((*i == '=') && equalsencode)) {
          if((*i == '=') && equalsencode)
            /* only skip the first equals sign */
            equalsencode = FALSE;
          result = Curl_dyn_addn(&enc, i, 1);
          if(result)
            return cc2cu(result);
        }
        else {
          unsigned char out[3]={'%'};
          Curl_hexbyte(&out[1], *i, TRUE);
          result = Curl_dyn_addn(&enc, out, 3);
          if(result)
            return cc2cu(result);
        }
      }
    }
    else {
      char *p;
      CURLcode result = Curl_dyn_add(&enc, part);
      if(result)
        return cc2cu(result);
      p = Curl_dyn_ptr(&enc);
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = Curl_raw_tolower(p[1]);
          p[2] = Curl_raw_tolower(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }
    newp = Curl_dyn_ptr(&enc);

    if(appendquery && newp) {
      /* Append the 'newp' string onto the old query. Add a '&' separator if
         none is present at the end of the existing query already */

      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        struct dynbuf qbuf;
        Curl_dyn_init(&qbuf, CURL_MAX_INPUT_LENGTH);

        if(Curl_dyn_addn(&qbuf, u->query, querylen)) /* add original query */
          goto nomem;

        if(addamperand) {
          if(Curl_dyn_addn(&qbuf, "&", 1))
            goto nomem;
        }
        if(Curl_dyn_add(&qbuf, newp))
          goto nomem;
        Curl_dyn_free(&enc);
        free(*storep);
        *storep = Curl_dyn_ptr(&qbuf);
        return CURLUE_OK;
nomem:
        Curl_dyn_free(&enc);
        return CURLUE_OUT_OF_MEMORY;
      }
    }

    else if(what == CURLUPART_HOST) {
      size_t n = Curl_dyn_len(&enc);
      if(!n && (flags & CURLU_NO_AUTHORITY)) {
        /* Skip hostname check, it is allowed to be empty. */
      }
      else {
        bool bad = FALSE;
        if(!n)
          bad = TRUE; /* empty hostname is not okay */
        else if(!urlencode) {
          /* if the host name part was not URL encoded here, it was set ready
             URL encoded so we need to decode it to check */
          size_t dlen;
          char *decoded = NULL;
          CURLcode result =
            Curl_urldecode(newp, n, &decoded, &dlen, REJECT_CTRL);
          if(result || hostname_check(u, decoded, dlen))
            bad = TRUE;
          free(decoded);
        }
        else if(hostname_check(u, (char *)CURL_UNCONST(newp), n))
          bad = TRUE;
        if(bad) {
          Curl_dyn_free(&enc);
          return CURLUE_BAD_HOSTNAME;
        }
      }
    }

    free(*storep);
    *storep = (char *)CURL_UNCONST(newp);
  }
  return CURLUE_OK;
}